

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_test.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::ResizeCspTest_TestResizeCspWorks_Test::~ResizeCspTest_TestResizeCspWorks_Test
          (ResizeCspTest_TestResizeCspWorks_Test *this)

{
  ResizeCspTest_TestResizeCspWorks_Test *in_stack_00000010;
  
  anon_unknown.dwarf_ccb0f7::ResizeCspTest_TestResizeCspWorks_Test::
  ~ResizeCspTest_TestResizeCspWorks_Test(in_stack_00000010);
  return;
}

Assistant:

TEST_P(ResizeCspTest, TestResizeCspWorks) {
#endif
  const aom_img_fmt_t image_formats[] = { AOM_IMG_FMT_I420, AOM_IMG_FMT_I444 };
  for (const aom_img_fmt_t &img_format : image_formats) {
    ResizingCspVideoSource video(img_format);
    init_flags_ = AOM_CODEC_USE_PSNR;
    cfg_.rc_min_quantizer = cfg_.rc_max_quantizer = 48;
    cfg_.g_lag_in_frames = 0;
    cfg_.g_profile = (img_format == AOM_IMG_FMT_I420) ? 0 : 1;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));

#if CONFIG_AV1_DECODER
    // Check we decoded the same number of frames as we attempted to encode
    ASSERT_EQ(frame_info_list_.size(), video.limit());
    frame_info_list_.clear();
#endif
  }
}